

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<bool>::erase
          (RepeatedField<bool> *this,const_iterator first,const_iterator last)

{
  const_iterator pbVar1;
  const_iterator __result;
  iterator pbVar2;
  long in_RDX;
  long in_RSI;
  bool *in_RDI;
  int in_stack_0000001c;
  RepeatedField<bool> *in_stack_00000020;
  size_type first_offset;
  RepeatedField<bool> *in_stack_ffffffffffffffc0;
  bool *in_stack_ffffffffffffffc8;
  
  pbVar1 = cbegin((RepeatedField<bool> *)0x3d82ec);
  if (in_RSI != in_RDX) {
    __result = cend(in_stack_ffffffffffffffc0);
    begin((RepeatedField<bool> *)0x3d8329);
    std::copy<bool_const*,bool*>(in_RDI,in_stack_ffffffffffffffc8,__result);
    cbegin((RepeatedField<bool> *)0x3d8351);
    Truncate(in_stack_00000020,in_stack_0000001c);
  }
  pbVar2 = begin((RepeatedField<bool> *)0x3d8372);
  return pbVar2 + ((int)in_RSI - (int)pbVar1);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}